

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

double av1_estimate_noise_from_single_plane_c
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  long local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  ulong local_50;
  int mat [3] [3];
  
  mat[0]._0_8_ = ZEXT48((uint)width);
  if (height < 3) {
    dVar14 = 0.0;
    iVar11 = 0;
  }
  else {
    local_50 = (ulong)(height - 1);
    lVar12 = 0;
    mat._8_8_ = 1;
    local_80 = 0;
    iVar11 = 0;
    do {
      mat[1]._4_8_ = lVar12;
      if (2 < (int)mat[0]._0_8_) {
        iVar10 = 1;
        do {
          lVar5 = -1;
          piVar6 = &local_78;
          lVar8 = lVar12;
          do {
            lVar5 = lVar5 + 1;
            lVar9 = 0;
            do {
              piVar6[lVar9] = (uint)src[(int)lVar8 + (int)lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar8 = lVar8 + (ulong)(uint)stride;
            piVar6 = piVar6 + 3;
          } while (lVar5 != 2);
          iVar7 = (((local_78 + local_60) - local_70) - local_58) + (local_6c - local_64) * 2;
          iVar1 = ((local_70 + local_78) - (local_60 + local_58)) + (local_74 - local_5c) * 2;
          iVar3 = -iVar7;
          if (0 < iVar7) {
            iVar3 = iVar7;
          }
          iVar7 = -iVar1;
          if (0 < iVar1) {
            iVar7 = iVar1;
          }
          if (iVar7 + iVar3 < edge_thresh) {
            uVar2 = local_70 + local_78 + local_60 + local_58 +
                    (local_74 + local_5c + local_64 + local_6c) * -2 + local_68 * 4;
            uVar4 = -uVar2;
            if (0 < (int)uVar2) {
              uVar4 = uVar2;
            }
            local_80 = local_80 + (ulong)uVar4;
            iVar11 = iVar11 + 1;
          }
          lVar12 = lVar12 + 1;
          bVar13 = iVar10 != width + -2;
          iVar10 = iVar10 + 1;
        } while (bVar13);
      }
      mat._8_8_ = mat._8_8_ + 1;
      lVar12 = mat[1]._4_8_ + (ulong)(uint)stride;
    } while (mat._8_8_ != local_50);
    dVar14 = (double)local_80;
  }
  if (iVar11 < 0x10) {
    dVar14 = -1.0;
  }
  else {
    dVar14 = (dVar14 / (double)(iVar11 * 6)) * 1.25331413732;
  }
  return dVar14;
}

Assistant:

double av1_estimate_noise_from_single_plane_c(const uint8_t *src, int height,
                                              int width, int stride,
                                              int edge_thresh) {
  int64_t accum = 0;
  int count = 0;

  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), 0);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), 0);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}